

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Gia_Man_t * Gia_ManDupDfsLitArray(Gia_Man_t *p,Vec_Int_t *vLits)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Gia_Man_t *p_00;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  bool bVar6;
  int iLitRes;
  int iLit;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  Vec_Int_t *vLits_local;
  Gia_Man_t *p_local;
  
  Gia_ManFillValue(p);
  iVar1 = Gia_ManObjNum(p);
  p_00 = Gia_ManStart(iVar1);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar4;
  pGVar5 = Gia_ManConst0(p);
  pGVar5->Value = 0;
  iLitRes = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCis);
    bVar6 = false;
    if (iLitRes < iVar1) {
      _iLit = Gia_ManCi(p,iLitRes);
      bVar6 = _iLit != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    uVar2 = Gia_ManAppendCi(p_00);
    _iLit->Value = uVar2;
    iLitRes = iLitRes + 1;
  }
  for (iLitRes = 0; iVar1 = Vec_IntSize(vLits), iLitRes < iVar1; iLitRes = iLitRes + 1) {
    iVar1 = Vec_IntEntry(vLits,iLitRes);
    iVar3 = Abc_Lit2Var(iVar1);
    pGVar5 = Gia_ManObj(p,iVar3);
    iVar3 = Gia_ManDupDfs2_rec(p_00,p,pGVar5);
    iVar1 = Abc_LitIsCompl(iVar1);
    iVar1 = Abc_LitNotCond(iVar3,iVar1);
    Gia_ManAppendCo(p_00,iVar1);
  }
  Gia_ManSetRegNum(p_00,0);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupDfsLitArray( Gia_Man_t * p, Vec_Int_t * vLits )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i, iLit, iLitRes;
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Vec_IntForEachEntry( vLits, iLit, i )
    {
        iLitRes = Gia_ManDupDfs2_rec( pNew, p, Gia_ManObj(p, Abc_Lit2Var(iLit)) );
        Gia_ManAppendCo( pNew, Abc_LitNotCond( iLitRes, Abc_LitIsCompl(iLit)) );
    }
    Gia_ManSetRegNum( pNew, 0 );
    return pNew;
}